

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
::DoMarkForArguments
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *this_00;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *in_RDI;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *con;
  value_type *cnt;
  int i;
  ExpressionAcceptanceLevel eal;
  size_type in_stack_ffffffffffffffc8;
  ExpressionAcceptanceLevel in_stack_ffffffffffffffd0;
  int i_00;
  BasicConstraintKeeper *in_stack_ffffffffffffffe0;
  undefined4 local_10;
  
  BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR(in_stack_ffffffffffffffe0);
  local_10 = 0;
  while( true ) {
    i_00 = local_10;
    sVar2 = std::
            deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container>_>
            ::size((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container>_>
                    *)0x38679d);
    if ((int)sVar2 <= i_00) break;
    std::
    deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container>_>
    ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container>_>
                  *)CONCAT44(i_00,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    bVar1 = Container::IsRedundant((Container *)CONCAT44(i_00,in_stack_ffffffffffffffd0));
    if (!bVar1) {
      this_00 = Container::GetCon((Container *)0x3867db);
      GetConverter((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
                    *)in_RDI);
      Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
      ::
      ConsiderMarkingArguments<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
                ((Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)this_00,in_RDI,i_00,in_stack_ffffffffffffffd0);
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void DoMarkForArguments() {
    const auto eal        // expr only
        = GetChosenAcceptanceLevelEXPR();
    for (int i=0; i< (int)cons_.size(); ++i) {
      const auto& cnt = cons_[i];
      if (!cnt.IsRedundant()) {      // Delegate actual logic to Converter
        const auto& con = cnt.GetCon();
        GetConverter().ConsiderMarkingArguments(con, i, eal);
      }
    }
  }